

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O3

QByteArray * __thiscall Moc::parsePropertyAccessor(QByteArray *__return_storage_ptr__,Moc *this)

{
  long lVar1;
  long lVar2;
  Symbol *pSVar3;
  long lVar4;
  Token TVar5;
  int iVar6;
  long in_FS_OFFSET;
  QArrayData *local_40 [3];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  iVar6 = 0;
  while( true ) {
    lVar1 = (this->super_Parser).symbols.d.size;
    lVar2 = (this->super_Parser).index;
    TVar5 = NOTOKEN;
    if (lVar2 < lVar1) {
      TVar5 = (this->super_Parser).symbols.d.ptr[lVar2].token;
    }
    if ((iVar6 == 0) && ((TVar5 == PP_RPAREN || (TVar5 == COMMA)))) break;
    pSVar3 = (this->super_Parser).symbols.d.ptr;
    lVar4 = lVar2;
    if (lVar2 < lVar1) {
      lVar4 = lVar2 + 1;
      (this->super_Parser).index = lVar4;
      TVar5 = pSVar3[lVar2].token;
      iVar6 = (iVar6 + (uint)(TVar5 == LPAREN)) - (uint)(TVar5 == PP_RPAREN);
    }
    QByteArray::mid((longlong)local_40,(longlong)&pSVar3[lVar4 + -1].lex);
    QByteArray::append(__return_storage_ptr__);
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray Moc::parsePropertyAccessor()
{
    int nesting = 0;
    QByteArray accessor;
    while (1) {
        Token t = peek();
        if (!nesting && (t == RPAREN || t == COMMA))
            break;
        t = next();
        if (t == LPAREN)
            ++nesting;
        if (t == RPAREN)
            --nesting;
        accessor += lexem();
    }
    return accessor;
}